

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::RenameASTDeclarations::operator()(RenameASTDeclarations *this,FuncDecl *node)

{
  bool bVar1;
  shared_ptr<mocker::ast::ASTNode> local_68 [2];
  shared_ptr<mocker::ast::ASTNode> local_48;
  reference local_38;
  shared_ptr<mocker::ast::VarDeclStmt> *param;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  *__range2;
  FuncDecl *node_local;
  RenameASTDeclarations *this_local;
  
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ::begin(&node->formalParameters);
  param = (shared_ptr<mocker::ast::VarDeclStmt> *)
          std::
          vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
          ::end(&node->formalParameters);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
                                *)&param);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
               ::operator*(&__end2);
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::VarDeclStmt,void>
              (&local_48,local_38);
    visit(this,&local_48);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_48);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
    ::operator++(&__end2);
  }
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::CompoundStmt,void>
            (local_68,&node->body);
  visit(this,local_68);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_68);
  return;
}

Assistant:

void operator()(ast::FuncDecl &node) const override {
    for (auto &param : node.formalParameters)
      visit(param);
    visit(node.body);
  }